

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

CubeFaceIntCoords tcu::remapCubeEdgeCoords(CubeFaceIntCoords *origCoords,int size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  CubeFaceIntCoords CVar5;
  ulong uStack_40;
  Vector<int,_3> local_34;
  
  uVar4 = (ulong)(uint)size;
  uVar2 = origCoords->s;
  uVar3 = origCoords->t;
  if ((size > (int)uVar2 && (int)uVar2 >= 0) && (size > (int)uVar3 && (int)uVar3 >= 0)) {
    uStack_40._0_4_ = origCoords->face;
    uStack_40._4_4_ = origCoords->s;
    uVar4 = uStack_40 >> 0x20;
    local_34.m_data[2] = uVar3;
    goto LAB_007b3b92;
  }
  if ((size <= (int)uVar2 || (int)uVar2 < 0) && (size <= (int)uVar3 || (int)uVar3 < 0)) {
    uStack_40 = 6;
    local_34.m_data[2] = 0xffffffff;
    uVar4 = 0xffffffff;
    goto LAB_007b3b92;
  }
  if ((int)uVar2 < size) {
    uVar4 = (ulong)uVar2;
  }
  if ((int)uVar2 < -1) {
    uVar4 = 0xffffffff;
  }
  uVar2 = size;
  if ((int)uVar3 < size) {
    uVar2 = uVar3;
  }
  if ((int)uVar3 < -1) {
    uVar2 = 0xffffffff;
  }
  Vector<int,_3>::Vector(&local_34);
  uVar3 = (uint)uVar4;
  switch(origCoords->face) {
  case CUBEFACE_NEGATIVE_X:
    local_34.m_data[1] = ~uVar2 + size;
    uVar4 = 0;
    local_34.m_data[2] = uVar3;
    goto LAB_007b3b47;
  case CUBEFACE_POSITIVE_X:
    uVar1 = size - 1;
    uVar4 = (ulong)uVar1;
    local_34.m_data[1] = uVar1 - uVar2;
    local_34.m_data[2] = uVar1 - uVar3;
    break;
  case CUBEFACE_NEGATIVE_Y:
    local_34.m_data[2] = ~uVar2 + size;
    local_34.m_data[1] = 0;
    break;
  case CUBEFACE_POSITIVE_Y:
    local_34.m_data[1] = size - 1;
    local_34.m_data[2] = uVar2;
    break;
  case CUBEFACE_NEGATIVE_Z:
    local_34.m_data[1] = (size + -1) - uVar2;
    local_34.m_data[2] = 0;
    uVar4 = (ulong)((size + -1) - uVar3);
    break;
  case CUBEFACE_POSITIVE_Z:
    local_34.m_data[1] = (size - 1U) - uVar2;
    local_34.m_data[2] = size - 1U;
    break;
  default:
    uVar4 = (ulong)(uint)local_34.m_data[0];
  }
  if ((int)uVar4 == -1) {
    uVar4 = (ulong)(uint)local_34.m_data[2];
    local_34.m_data[2] = ~local_34.m_data[1] + size;
    uStack_40 = 0;
  }
  else {
LAB_007b3b47:
    if ((int)uVar4 == size) {
      uVar4 = (ulong)(uint)((size + -1) - local_34.m_data[2]);
      uStack_40 = 1;
      local_34.m_data[2] = (size + -1) - local_34.m_data[1];
    }
    else if (local_34.m_data[1] == 0xffffffff) {
      local_34.m_data[2] = ~local_34.m_data[2] + size;
      uStack_40 = 2;
    }
    else if (local_34.m_data[1] == size) {
      uStack_40 = 3;
    }
    else if (local_34.m_data[2] == 0xffffffff) {
      local_34.m_data[2] = (size + -1) - local_34.m_data[1];
      uStack_40 = 4;
      uVar4 = (ulong)(uint)((size + -1) - (int)uVar4);
    }
    else if (local_34.m_data[2] == size) {
      uStack_40 = 5;
      local_34.m_data[2] = ~local_34.m_data[1] + size;
    }
    else {
      uStack_40 = 6;
      uVar4 = 0xffffffff;
      local_34.m_data[2] = 0xffffffff;
    }
  }
LAB_007b3b92:
  CVar5._0_8_ = uStack_40 & 0xffffffff | uVar4 << 0x20;
  CVar5.t = local_34.m_data[2];
  return CVar5;
}

Assistant:

CubeFaceIntCoords remapCubeEdgeCoords (const CubeFaceIntCoords& origCoords, int size)
{
	bool uInBounds = de::inBounds(origCoords.s, 0, size);
	bool vInBounds = de::inBounds(origCoords.t, 0, size);

	if (uInBounds && vInBounds)
		return origCoords;

	if (!uInBounds && !vInBounds)
		return CubeFaceIntCoords(CUBEFACE_LAST, -1, -1);

	IVec2 coords(wrap(Sampler::CLAMP_TO_BORDER, origCoords.s, size),
				 wrap(Sampler::CLAMP_TO_BORDER, origCoords.t, size));
	IVec3 canonizedCoords;

	// Map the uv coordinates to canonized 3d coordinates.

	switch (origCoords.face)
	{
		case CUBEFACE_NEGATIVE_X: canonizedCoords = IVec3(0,					size-1-coords.y(),	coords.x());			break;
		case CUBEFACE_POSITIVE_X: canonizedCoords = IVec3(size-1,				size-1-coords.y(),	size-1-coords.x());		break;
		case CUBEFACE_NEGATIVE_Y: canonizedCoords = IVec3(coords.x(),			0,					size-1-coords.y());		break;
		case CUBEFACE_POSITIVE_Y: canonizedCoords = IVec3(coords.x(),			size-1,				coords.y());			break;
		case CUBEFACE_NEGATIVE_Z: canonizedCoords = IVec3(size-1-coords.x(),	size-1-coords.y(),	0);						break;
		case CUBEFACE_POSITIVE_Z: canonizedCoords = IVec3(coords.x(),			size-1-coords.y(),	size-1);				break;
		default: DE_ASSERT(false);
	}

	// Find an appropriate face to re-map the coordinates to.

	if (canonizedCoords.x() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_X, IVec2(canonizedCoords.z(), size-1-canonizedCoords.y()));

	if (canonizedCoords.x() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_X, IVec2(size-1-canonizedCoords.z(), size-1-canonizedCoords.y()));

	if (canonizedCoords.y() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_Y, IVec2(canonizedCoords.x(), size-1-canonizedCoords.z()));

	if (canonizedCoords.y() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_Y, IVec2(canonizedCoords.x(), canonizedCoords.z()));

	if (canonizedCoords.z() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_Z, IVec2(size-1-canonizedCoords.x(), size-1-canonizedCoords.y()));

	if (canonizedCoords.z() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_Z, IVec2(canonizedCoords.x(), size-1-canonizedCoords.y()));

	DE_ASSERT(false);
	return CubeFaceIntCoords(CUBEFACE_LAST, IVec2(-1));
}